

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_1acb919::File::write(File *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  bool bVar2;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lock;
  size_t n_local;
  void *buffer_local;
  File *this_local;
  
  lock._8_8_ = __buf;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->writeMutex);
  sVar1 = fwrite((void *)CONCAT44(in_register_00000034,__fd),1,lock._8_8_,(FILE *)this->f);
  bVar2 = sVar1 == lock._8_8_;
  if (bVar2) {
    fflush((FILE *)this->f);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar2);
}

Assistant:

bool write(const void* buffer, size_t n) override {
    std::unique_lock<std::mutex> lock(writeMutex);
    if (fwrite(buffer, 1, n, f) == n) {
      fflush(f);
      return true;
    }
    return false;
  }